

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int parse_error_1;
  int mux_version;
  int enc_version;
  int parse_error;
  int ok;
  CommandLineArguments cmd_args;
  int have_input;
  int c;
  WebPData webp_data;
  WebPPicture pic;
  WebPConfig config;
  WebPAnimEncoderOptions anim_config;
  int height;
  int width;
  int loop_count;
  int timestamp_ms;
  int duration;
  int pic_num;
  int verbose;
  WebPAnimEncoder *enc;
  char *output;
  uint in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc8;
  bool bVar6;
  undefined1 in_stack_fffffffffffffdc9;
  undefined1 in_stack_fffffffffffffdca;
  undefined1 in_stack_fffffffffffffdcb;
  undefined4 in_stack_fffffffffffffdcc;
  int iVar7;
  int in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  int local_1f4;
  uint local_1d8;
  uint local_1d4;
  WebPConfig *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  WebPPicture *in_stack_fffffffffffffe40;
  WebPAnimEncoder *in_stack_fffffffffffffe48;
  WebPConfig local_dc;
  undefined4 local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  WebPAnimEncoder *local_20;
  long local_18;
  char *local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_20 = (WebPAnimEncoder *)0x0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 100;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  bVar6 = false;
  uVar2 = ExUtilInitCommandLineArguments
                    (in_stack_fffffffffffffdd0,
                     (char **)CONCAT44(in_stack_fffffffffffffdcc,
                                       CONCAT13(in_stack_fffffffffffffdcb,
                                                CONCAT12(in_stack_fffffffffffffdca,
                                                         CONCAT11(in_stack_fffffffffffffdc9,
                                                                  in_stack_fffffffffffffdc8)))),
                     (CommandLineArguments *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  if (uVar2 == 0) {
    local_4 = 1;
  }
  else {
    local_10 = in_stack_fffffffffffffde8;
    local_8 = in_stack_fffffffffffffde0;
    WebPDataInit((WebPData *)0x1047bd);
    iVar3 = WebPAnimEncoderOptionsInit((WebPAnimEncoderOptions *)0x1047ca);
    if (((iVar3 == 0) || (iVar3 = WebPConfigInit((WebPConfig *)0x1047dc), iVar3 == 0)) ||
       (iVar3 = WebPPictureInit((WebPPicture *)0x1047eb), iVar3 == 0)) {
      fprintf(_stderr,"Library version mismatch!\n");
      uVar2 = 0;
    }
    else {
      for (local_1f4 = 0; uVar2 != 0 && local_1f4 < local_8; local_1f4 = local_1f4 + 1) {
        if (**(char **)(local_10 + (long)local_1f4 * 8) == '-') {
          in_stack_fffffffffffffdd8 = 0;
          iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-o");
          if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
            pcVar1 = local_10 + (long)local_1f4 * 8;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            local_1f4 = local_1f4 + 1;
            local_18 = *(long *)(local_10 + (long)local_1f4 * 8);
          }
          else {
            iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-kmin");
            if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
              pcVar1 = local_10 + (long)local_1f4 * 8;
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              local_1f4 = local_1f4 + 1;
              local_5c = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                       in_stack_fffffffffffffdc0),
                                      in_stack_fffffffffffffdbc,(int *)0x104949);
            }
            else {
              iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-kmax");
              if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
                pcVar1 = local_10 + (long)local_1f4 * 8;
                pcVar1[0] = '\0';
                pcVar1[1] = '\0';
                pcVar1[2] = '\0';
                pcVar1[3] = '\0';
                pcVar1[4] = '\0';
                pcVar1[5] = '\0';
                pcVar1[6] = '\0';
                pcVar1[7] = '\0';
                local_1f4 = local_1f4 + 1;
                local_58 = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                         in_stack_fffffffffffffdc0),
                                        in_stack_fffffffffffffdbc,(int *)0x1049c2);
              }
              else {
                iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-loop");
                if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
                  pcVar1 = local_10 + (long)local_1f4 * 8;
                  pcVar1[0] = '\0';
                  pcVar1[1] = '\0';
                  pcVar1[2] = '\0';
                  pcVar1[3] = '\0';
                  pcVar1[4] = '\0';
                  pcVar1[5] = '\0';
                  pcVar1[6] = '\0';
                  pcVar1[7] = '\0';
                  local_1f4 = local_1f4 + 1;
                  local_34 = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                           in_stack_fffffffffffffdc0),
                                          in_stack_fffffffffffffdbc,(int *)0x104a3f);
                  if ((int)local_34 < 0) {
                    fprintf(_stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_34);
                    in_stack_fffffffffffffdd8 = 1;
                  }
                }
                else {
                  iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-min_size");
                  if (iVar3 == 0) {
                    local_60 = 1;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-mixed");
                    if (iVar3 == 0) {
                      local_54 = 1;
                      local_dc.lossless = 0;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-v");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-h");
                        if ((iVar3 == 0) ||
                           (iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-help"),
                           iVar3 == 0)) {
                          Help();
                        }
                        else {
                          iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-version");
                          if (iVar3 != 0) goto LAB_00104c53;
                          uVar4 = WebPGetEncoderVersion();
                          uVar5 = WebPGetMuxVersion();
                          printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                                 (ulong)((int)uVar4 >> 0x10 & 0xff),(ulong)((int)uVar4 >> 8 & 0xff),
                                 (ulong)(uVar4 & 0xff),(ulong)((int)uVar5 >> 0x10 & 0xff),
                                 (ulong)((int)uVar5 >> 8 & 0xff),uVar5 & 0xff);
                        }
                        goto LAB_0010521c;
                      }
                      local_24 = 1;
                    }
                  }
                }
              }
            }
          }
          uVar2 = (uint)((in_stack_fffffffffffffdd8 != 0 ^ 0xffU) & 1);
          if (uVar2 == 0) goto LAB_0010521c;
          pcVar1 = local_10 + (long)local_1f4 * 8;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        else {
          bVar6 = true;
        }
LAB_00104c53:
      }
      if (bVar6) {
        local_28 = 0;
        local_dc.lossless = 1;
        for (local_1f4 = 0; uVar2 != 0 && local_1f4 < local_8; local_1f4 = local_1f4 + 1) {
          if (*(long *)(local_10 + (long)local_1f4 * 8) != 0) {
            if (**(char **)(local_10 + (long)local_1f4 * 8) == '-') {
              iVar7 = 0;
              iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-lossy");
              if (iVar3 == 0) {
                if (local_54 == 0) {
                  local_dc.lossless = 0;
                }
              }
              else {
                iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-lossless");
                if (iVar3 == 0) {
                  if (local_54 == 0) {
                    local_dc.lossless = 1;
                  }
                }
                else {
                  iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-q");
                  if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
                    local_1f4 = local_1f4 + 1;
                    local_dc.quality =
                         ExUtilGetFloat((char *)CONCAT44(in_stack_fffffffffffffde4,
                                                         in_stack_fffffffffffffde0),
                                        (int *)CONCAT44(uVar2,in_stack_fffffffffffffdd8));
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-m");
                    if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
                      local_1f4 = local_1f4 + 1;
                      local_dc.method =
                           ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                         in_stack_fffffffffffffdc0),
                                        in_stack_fffffffffffffdbc,(int *)0x104e43);
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-d");
                      if ((iVar3 == 0) && (local_1f4 + 1 < local_8)) {
                        local_1f4 = local_1f4 + 1;
                        local_2c = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdc4,
                                                                 in_stack_fffffffffffffdc0),
                                                in_stack_fffffffffffffdbc,(int *)0x104ea7);
                        if ((int)local_2c < 1) {
                          fprintf(_stderr,"Invalid negative duration (%d)\n",(ulong)local_2c);
                          iVar7 = 1;
                        }
                      }
                      else {
                        iVar7 = 1;
                        fprintf(_stderr,"Unknown option [%s]\n",
                                *(undefined8 *)(local_10 + (long)local_1f4 * 8));
                      }
                    }
                  }
                }
              }
              uVar2 = (uint)((iVar7 != 0 ^ 0xffU) & 1);
              if (uVar2 == 0) {
                uVar2 = 0;
                goto LAB_0010521c;
              }
            }
            else {
              if ((uVar2 != 0) && (uVar2 = WebPValidateConfig(&local_dc), uVar2 == 0)) {
                fprintf(_stderr,"Invalid configuration.\n");
                goto LAB_0010521c;
              }
              uVar2 = ReadImage((char *)CONCAT44(uVar2,in_stack_fffffffffffffdd8),
                                (WebPPicture *)
                                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
              if (uVar2 == 0) {
                uVar2 = 0;
                goto LAB_0010521c;
              }
              if (local_20 == (WebPAnimEncoder *)0x0) {
                local_38 = local_1d8;
                local_3c = local_1d4;
                local_20 = WebPAnimEncoderNew(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0,
                                              (WebPAnimEncoderOptions *)
                                              CONCAT44(in_stack_fffffffffffffdbc,
                                                       in_stack_fffffffffffffdb8));
                uVar2 = (uint)(local_20 != (WebPAnimEncoder *)0x0);
                if (uVar2 == 0) {
                  fprintf(_stderr,"Could not create WebPAnimEncoder object.\n");
                }
              }
              if ((uVar2 != 0) &&
                 (uVar2 = (uint)(local_38 == local_1d8 && local_3c == local_1d4), uVar2 == 0)) {
                in_stack_fffffffffffffdb8 = local_3c;
                fprintf(_stderr,
                        "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n",
                        (ulong)local_28,(ulong)local_1d8,(ulong)local_1d4,(ulong)local_38);
              }
              if ((uVar2 != 0) &&
                 (uVar2 = WebPAnimEncoderAdd(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                             in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30),
                 uVar2 == 0)) {
                fprintf(_stderr,"Error while adding frame #%d\n",(ulong)local_28);
              }
              WebPPictureFree((WebPPicture *)0x105103);
              if (uVar2 == 0) {
                uVar2 = 0;
                goto LAB_0010521c;
              }
              if (local_24 != 0) {
                fprintf(_stderr,"Added frame #%3d at time %4d (file: %s)\n",(ulong)local_28,
                        (ulong)local_30,*(undefined8 *)(local_10 + (long)local_1f4 * 8));
              }
              local_30 = local_2c + local_30;
              local_28 = local_28 + 1;
            }
          }
        }
        bVar6 = false;
        if (uVar2 != 0) {
          iVar3 = WebPAnimEncoderAdd(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                     in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
          bVar6 = iVar3 != 0;
        }
        in_stack_fffffffffffffdc4 = in_stack_fffffffffffffdc4 & 0xffffff;
        if (bVar6 != false) {
          iVar3 = WebPAnimEncoderAssemble
                            ((WebPAnimEncoder *)(ulong)CONCAT14(bVar6,in_stack_fffffffffffffdd8),
                             (WebPData *)
                             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          in_stack_fffffffffffffdc4 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffdc4);
        }
        uVar2 = in_stack_fffffffffffffdc4 >> 0x18;
        if (uVar2 == 0) {
          fprintf(_stderr,"Error during final animation assembly.\n");
        }
      }
      else {
        fprintf(_stderr,"No input file(s) for generating animation!\n");
      }
    }
LAB_0010521c:
    WebPAnimEncoderDelete
              ((WebPAnimEncoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if ((uVar2 != 0) && (0 < (int)local_34)) {
      uVar2 = SetLoopCount(in_stack_fffffffffffffde0,
                           (WebPData *)CONCAT44(uVar2,in_stack_fffffffffffffdd8));
    }
    if (uVar2 != 0) {
      if (local_18 == 0) {
        fprintf(_stderr,"[no output file specified]   ");
      }
      else {
        uVar2 = ImgIoUtilWriteFile(in_stack_fffffffffffffde8,
                                   (uint8_t *)
                                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                                   CONCAT44(uVar2,in_stack_fffffffffffffdd8));
        if (uVar2 != 0) {
          fprintf(_stderr,"output file: %s     ",local_18);
        }
      }
    }
    if (uVar2 != 0) {
      fprintf(_stderr,"[%d frames, %u bytes].\n",(ulong)local_28);
    }
    WebPDataClear((WebPData *)0x1052f6);
    ExUtilDeleteCommandLineArguments((CommandLineArguments *)0x105300);
    local_4 = (uint)(uVar2 == 0);
  }
  return local_4;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(1);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        goto End;
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}